

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O3

void __thiscall ModbusAnalyzer::SetupResults(ModbusAnalyzer *this)

{
  ModbusAnalyzerResults *pMVar1;
  ModbusAnalyzerResults *this_00;
  
  this_00 = (ModbusAnalyzerResults *)operator_new(0x20);
  ModbusAnalyzerResults::ModbusAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  pMVar1 = (this->mResults)._M_ptr;
  if (pMVar1 != this_00) {
    if (pMVar1 != (ModbusAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pMVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void ModbusAnalyzer::SetupResults()
{
    // Unlike the worker thread, this function is called from the GUI thread
    // we need to reset the Results object here because it is exposed for direct access by the GUI, and it can't be deleted from the
    // WorkerThread

    mResults.reset( new ModbusAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}